

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O2

Vec_Wec_t * Spl_ManToWecMapping(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar3;
  uint uVar4;
  long lVar5;
  uint i;
  uint uVar6;
  uint local_48;
  Vec_Int_t *local_40;
  
  uVar6 = p->nObjs;
  p_00 = (Vec_Wec_t *)malloc(0x10);
  local_48 = 8;
  if (6 < uVar6 - 1) {
    local_48 = uVar6;
  }
  p_00->nCap = local_48;
  if (local_48 == 0) {
    local_40 = (Vec_Int_t *)0x0;
  }
  else {
    local_40 = (Vec_Int_t *)calloc((long)(int)local_48,0x10);
  }
  p_00->pArray = local_40;
  p_00->nSize = uVar6;
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x49,"Vec_Wec_t *Spl_ManToWecMapping(Gia_Man_t *)");
  }
  uVar2 = uVar6;
  i = 1;
  do {
    if ((int)uVar2 <= (int)i) {
      return p_00;
    }
    iVar1 = Vec_IntEntry(p->vMapping,i);
    uVar4 = i + 1;
    if (iVar1 != 0) {
      lVar5 = 0;
      while( true ) {
        pVVar3 = p->vMapping;
        iVar1 = Vec_IntEntry(pVVar3,i);
        iVar1 = Vec_IntEntry(pVVar3,iVar1);
        if (iVar1 <= lVar5) break;
        pVVar3 = p->vMapping;
        uVar2 = Vec_IntEntry(pVVar3,i);
        if (((int)uVar2 < 0) || (pVVar3->nSize <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar1 = pVVar3->pArray[(ulong)uVar2 + lVar5 + 1];
        if ((int)uVar6 <= (int)i) {
          uVar2 = uVar6 * 2;
          if ((int)(uVar6 * 2) <= (int)uVar4) {
            uVar2 = uVar4;
          }
          if (uVar2 - local_48 != 0 && (int)local_48 <= (int)uVar2) {
            if (local_40 == (Vec_Int_t *)0x0) {
              local_40 = (Vec_Int_t *)malloc((ulong)uVar2 << 4);
            }
            else {
              local_40 = (Vec_Int_t *)realloc(local_40,(ulong)uVar2 << 4);
            }
            p_00->pArray = local_40;
            memset(local_40 + (int)local_48,0,(long)(int)(uVar2 - local_48) << 4);
            p_00->nCap = uVar2;
            local_48 = uVar2;
          }
          p_00->nSize = uVar4;
          uVar6 = uVar4;
        }
        pVVar3 = Vec_WecEntry(p_00,i);
        Vec_IntPush(pVVar3,iVar1);
        lVar5 = lVar5 + 1;
      }
    }
    uVar2 = p->nObjs;
    i = uVar4;
  } while( true );
}

Assistant:

Vec_Wec_t * Spl_ManToWecMapping( Gia_Man_t * p )
{
    Vec_Wec_t * vMapping = Vec_WecStart( Gia_ManObjNum(p) );
    int Obj, Fanin, k;
    assert( Gia_ManHasMapping(p) );
    Gia_ManForEachLut( p, Obj )
        Gia_LutForEachFanin( p, Obj, Fanin, k )
            Vec_WecPush( vMapping, Obj, Fanin );
    return vMapping;
}